

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_ffh_tonumber(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  lua_State *in_RDI;
  bool bVar3;
  double dVar4;
  undefined1 auVar5 [16];
  lua_Number n;
  unsigned_long ul;
  uint neg;
  char *ep;
  char *p;
  CType *ct;
  CTState *cts;
  TValue *o;
  int32_t base;
  CTState *cts_1;
  ErrMsg in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  lua_State *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  GCstr *local_d8;
  GCstr *local_d0;
  CType *local_c8;
  CTState *local_c0;
  TValue *local_b8;
  int32_t local_ac;
  lua_State *local_a8;
  CTInfo in_stack_ffffffffffffff64;
  TValue *in_stack_ffffffffffffff68;
  uint8_t *in_stack_ffffffffffffff70;
  CType *in_stack_ffffffffffffff78;
  CTState *in_stack_ffffffffffffff80;
  
  local_a8 = in_RDI;
  local_ac = lj_lib_optint((lua_State *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                           (int32_t)in_stack_ffffffffffffff18);
  if (local_ac == 10) {
    local_b8 = lj_lib_checkany(in_stack_ffffffffffffff10,
                               CONCAT13(in_stack_ffffffffffffff0f,
                                        CONCAT12(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff0c
                                                )));
    bVar3 = true;
    if ((0xfffeffff < (local_b8->field_2).it) &&
       (bVar3 = false, (local_b8->field_2).it == 0xfffffffb)) {
      iVar1 = lj_strscan_num((GCstr *)in_stack_ffffffffffffff10,
                             (TValue *)
                             CONCAT17(1,(uint7)CONCAT24(in_stack_ffffffffffffff0c,
                                                        in_stack_ffffffffffffff08)));
      bVar3 = iVar1 != 0;
    }
    if (bVar3) {
      local_a8->base[-1].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)local_b8;
      return 2;
    }
    if ((local_b8->field_2).it == 0xfffffff5) {
      local_c0 = (CTState *)(ulong)*(uint *)((ulong)(local_a8->glref).ptr32 + 0x194);
      local_c0->L = local_a8;
      local_c8 = lj_ctype_rawref(local_c0,(uint)*(ushort *)((ulong)(local_b8->u32).lo + 6));
      if (local_c8->info >> 0x1c == 5) {
        local_c8 = local_c0->tab + (local_c8->info & 0xffff);
      }
      if ((local_c8->info >> 0x1c == 0) || ((local_c8->info & 0xf4000000) == 0x34000000)) {
        lj_cconv_ct_tv(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                       ,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
        return 2;
      }
    }
  }
  else {
    local_d0 = lj_lib_checkstr((lua_State *)
                               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    local_d0 = local_d0 + 1;
    iVar1 = 0;
    if ((local_ac < 2) || (0x24 < local_ac)) {
      lj_err_arg(in_stack_ffffffffffffff10,
                 CONCAT13(in_stack_ffffffffffffff0f,
                          CONCAT12(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff0c)),
                 in_stack_ffffffffffffff08);
    }
    while ((""[(ulong)(byte)(local_d0->nextgc).gcptr32 + 1] & 2) != 0) {
      local_d0 = (GCstr *)((long)&(local_d0->nextgc).gcptr32 + 1);
    }
    if ((char)(local_d0->nextgc).gcptr32 == '-') {
      local_d0 = (GCstr *)((long)&(local_d0->nextgc).gcptr32 + 1);
      iVar1 = 1;
    }
    else if ((char)(local_d0->nextgc).gcptr32 == '+') {
      local_d0 = (GCstr *)((long)&(local_d0->nextgc).gcptr32 + 1);
    }
    if (((""[(ulong)(byte)(local_d0->nextgc).gcptr32 + 1] & 0x68) != 0) &&
       (uVar2 = strtoul((char *)local_d0,(char **)&local_d8,local_ac), local_d0 != local_d8)) {
      while ((""[(ulong)(byte)(local_d8->nextgc).gcptr32 + 1] & 2) != 0) {
        local_d8 = (GCstr *)((long)&(local_d8->nextgc).gcptr32 + 1);
      }
      if ((char)(local_d8->nextgc).gcptr32 == '\0') {
        auVar5._8_4_ = (int)(uVar2 >> 0x20);
        auVar5._0_8_ = uVar2;
        auVar5._12_4_ = 0x45300000;
        dVar4 = (auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        if (iVar1 != 0) {
          dVar4 = -dVar4;
        }
        local_a8->base[-1].n = dVar4;
        return 2;
      }
    }
  }
  *(undefined4 *)((long)local_a8->base + -4) = 0xffffffff;
  return 2;
}

Assistant:

LJLIB_ASM(tonumber)		LJLIB_REC(.)
{
  int32_t base = lj_lib_optint(L, 2, 10);
  if (base == 10) {
    TValue *o = lj_lib_checkany(L, 1);
    if (lj_strscan_numberobj(o)) {
      copyTV(L, L->base-1-LJ_FR2, o);
      return FFH_RES(1);
    }
#if LJ_HASFFI
    if (tviscdata(o)) {
      CTState *cts = ctype_cts(L);
      CType *ct = lj_ctype_rawref(cts, cdataV(o)->ctypeid);
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info) || ctype_iscomplex(ct->info)) {
	if (LJ_DUALNUM && ctype_isinteger_or_bool(ct->info) &&
	    ct->size <= 4 && !(ct->size == 4 && (ct->info & CTF_UNSIGNED))) {
	  int32_t i;
	  lj_cconv_ct_tv(cts, ctype_get(cts, CTID_INT32), (uint8_t *)&i, o, 0);
	  setintV(L->base-1-LJ_FR2, i);
	  return FFH_RES(1);
	}
	lj_cconv_ct_tv(cts, ctype_get(cts, CTID_DOUBLE),
		       (uint8_t *)&(L->base-1-LJ_FR2)->n, o, 0);
	return FFH_RES(1);
      }
    }
#endif
  } else {
    const char *p = strdata(lj_lib_checkstr(L, 1));
    char *ep;
    unsigned int neg = 0;
    unsigned long ul;
    if (base < 2 || base > 36)
      lj_err_arg(L, 2, LJ_ERR_BASERNG);
    while (lj_char_isspace((unsigned char)(*p))) p++;
    if (*p == '-') { p++; neg = 1; } else if (*p == '+') { p++; }
    if (lj_char_isalnum((unsigned char)(*p))) {
      ul = strtoul(p, &ep, base);
      if (p != ep) {
	while (lj_char_isspace((unsigned char)(*ep))) ep++;
	if (*ep == '\0') {
	  if (LJ_DUALNUM && LJ_LIKELY(ul < 0x80000000u+neg)) {
	    if (neg) ul = ~ul+1u;
	    setintV(L->base-1-LJ_FR2, (int32_t)ul);
	  } else {
	    lua_Number n = (lua_Number)ul;
	    if (neg) n = -n;
	    setnumV(L->base-1-LJ_FR2, n);
	  }
	  return FFH_RES(1);
	}
      }
    }
  }
  setnilV(L->base-1-LJ_FR2);
  return FFH_RES(1);
}